

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pool.c
# Opt level: O3

void * chck_pool_iter(chck_pool *pool,size_t *iter,_Bool reverse)

{
  uint8_t uVar1;
  uint8_t *puVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  ulong uVar5;
  void *pvVar6;
  ulong uVar7;
  
  if ((pool != (chck_pool *)0x0) && (iter != (size_t *)0x0)) {
    if ((pool->items).member != 0) {
      uVar5 = *iter;
      uVar7 = (pool->map).member;
      do {
        auVar3._8_8_ = 0;
        auVar3._0_8_ = uVar5;
        auVar4._8_8_ = 0;
        auVar4._0_8_ = uVar7;
        uVar5 = SUB168(auVar3 * auVar4,0);
        if (((SUB168(auVar3 * auVar4,8) == 0) && (uVar5 < (pool->map).used)) &&
           (puVar2 = (pool->map).buffer, puVar2 != (uint8_t *)0x0)) {
          uVar1 = puVar2[uVar5];
          pvVar6 = pool_buffer_iter(&pool->items,iter,reverse);
          if (pvVar6 != (void *)0x0 && uVar1 != '\0') {
            return pvVar6;
          }
        }
        else {
          pool_buffer_iter(&pool->items,iter,reverse);
        }
        uVar5 = *iter;
        uVar7 = (pool->map).member;
      } while (uVar5 < (pool->map).used / uVar7);
    }
    return (void *)0x0;
  }
  __assert_fail("pool && iter",
                "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/pool/pool.c",
                0x19c,"void *chck_pool_iter(const struct chck_pool *, size_t *, _Bool)");
}

Assistant:

void*
chck_pool_iter(const struct chck_pool *pool, size_t *iter, bool reverse)
{
   assert(pool && iter);

   if (!pool->items.member)
      return NULL;

   void *current = NULL;
   do {
      const bool mapped = pool_is_mapped(pool, *iter);
      current = pool_buffer_iter(&pool->items, iter, reverse);
      current = (mapped ? current : NULL);
   } while (!current && *iter < pool->map.used / pool->map.member);

   return current;
}